

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialog::closeEvent(QDialog *this,QCloseEvent *e)

{
  bool bVar1;
  long in_FS_OFFSET;
  QWeakPointer<QObject> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((this->super_QWidget).data)->field_0x12 & 3) != 0) {
    bVar1 = QWhatsThis::inWhatsThisMode();
    if (bVar1) {
      QWhatsThis::leaveWhatsThisMode();
    }
  }
  if ((((this->super_QWidget).data)->widget_attributes & 0x8000) == 0) {
    e[0xc] = (QCloseEvent)0x1;
  }
  else {
    local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_38.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    QPointer<QObject>::QPointer<void>((QPointer<QObject> *)&local_38,(QObject *)this);
    (**(code **)(*(long *)&this->super_QWidget + 0x1c0))(this);
    bVar1 = QPointer::operator_cast_to_bool((QPointer *)&local_38);
    if ((bVar1) && ((((this->super_QWidget).data)->widget_attributes & 0x8000) != 0)) {
      e[0xc] = (QCloseEvent)0x0;
    }
    QWeakPointer<QObject>::~QWeakPointer(&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::closeEvent(QCloseEvent *e)
{
#if QT_CONFIG(whatsthis)
    if (isModal() && QWhatsThis::inWhatsThisMode())
        QWhatsThis::leaveWhatsThisMode();
#endif
    if (isVisible()) {
        QPointer<QObject> that = this;
        reject();
        if (that && isVisible())
            e->ignore();
    } else {
        e->accept();
    }
}